

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixcomm.c
# Opt level: O0

LispPTR Unix_handlecomm(LispPTR *args)

{
  UJTYPE UVar1;
  undefined4 uVar2;
  uint uVar3;
  __pid_t __pgrp;
  uint uVar4;
  int iVar5;
  LispPTR LVar6;
  LispPTR *pLVar7;
  ulong uVar8;
  size_t sVar9;
  char *pcVar10;
  DLword *pDVar11;
  ssize_t sVar12;
  int *piVar13;
  bool bVar14;
  LispPTR local_26c;
  uint local_1fc;
  int i_2;
  DLword *bufp_1;
  int streamFD;
  uint local_1dc;
  int newFD;
  int sockFD_2;
  ulong local_1d0;
  size_t lf_ii;
  size_t lf_i;
  char *lf_dptr;
  char *lf_sptr;
  size_t lf_length;
  short *lf_sbase;
  char *lf_dp;
  char *lf_base;
  OneDArray *lf_arrayp;
  sockaddr_un sock_1;
  int sockFD_1;
  winsize w;
  int pty;
  int pgrp;
  int cols;
  int rows;
  int terno;
  DLword *bufp;
  byte local_e8;
  byte local_e7;
  unsigned_short len;
  int Master;
  char SlavePTY [32];
  int i_1;
  int i;
  undefined1 local_ae [8];
  sockaddr_un sock;
  int sockFD;
  int PipeFD;
  char *PipeName;
  byte local_28;
  byte local_27;
  byte local_26;
  byte local_25;
  uchar buf [1];
  uchar ch;
  uchar d [6];
  int slot;
  int dest;
  int command;
  LispPTR *args_local;
  
  if ((*args & 0xfff0000) == 0xe0000) {
    slot = *args & 0xffff;
LAB_00160049:
    switch(slot) {
    case 0:
      sock.sun_path._100_4_ = socket(1,1,0);
      if ((int)sock.sun_path._100_4_ < 0) {
        perror("socket open");
        args_local._4_4_ = 0;
      }
      else {
        pcVar10 = build_socket_pathname(sock.sun_path._100_4_);
        memset(local_ae,0,0x6e);
        local_ae._0_2_ = 1;
        strcpy(local_ae + 2,pcVar10);
        iVar5 = bind(sock.sun_path._100_4_,(sockaddr *)local_ae,0x6e);
        if (iVar5 < 0) {
          close(sock.sun_path._100_4_);
          perror("binding sockets");
          unlink(pcVar10);
          args_local._4_4_ = 0;
        }
        else {
          iVar5 = listen(sock.sun_path._100_4_,1);
          if (iVar5 < 0) {
            perror("Listen");
          }
          memset((void *)((long)&PipeName + 6),0,6);
          PipeName._6_1_ = 0x46;
          local_27 = sock.sun_path[100];
          write(UnixPipeOut,(void *)((long)&PipeName + 6),6);
          WriteLispStringToPipe(args[1]);
          SAFEREAD(UnixPipeIn,(uchar *)((long)&PipeName + 6),6);
          if (local_27 == '\x01') {
            do {
              alarm(TIMEOUT_TIME);
              do {
                piVar13 = __errno_location();
                *piVar13 = 0;
                sock.sun_path._104_4_ =
                     accept(sock.sun_path._100_4_,(sockaddr *)0x0,(socklen_t *)0x0);
                bVar14 = false;
                if (sock.sun_path._104_4_ == -1) {
                  piVar13 = __errno_location();
                  bVar14 = *piVar13 == 4;
                }
              } while (bVar14);
              alarm(0);
              uVar2 = sock.sun_path._104_4_;
              if (-1 < (int)sock.sun_path._104_4_) {
                uVar4 = fcntl(sock.sun_path._104_4_,3,0);
                iVar5 = fcntl(uVar2,4,(ulong)(uVar4 | 0x800));
                if (iVar5 != -1) {
                  UJ[(int)sock.sun_path._104_4_].type = UJPROCESS;
                  UJ[(int)sock.sun_path._104_4_].status = -1;
                  UJ[(int)sock.sun_path._104_4_].PID =
                       CONCAT13(local_25,CONCAT12(local_26,CONCAT11(PipeName._7_1_,local_28)));
                  close(sock.sun_path._100_4_);
                  unlink(pcVar10);
                  LVar6 = GetSmallp((long)(int)sock.sun_path._104_4_);
                  return LVar6;
                }
                perror("setting up fifo to nodelay");
                return 0;
              }
              piVar13 = __errno_location();
            } while (*piVar13 == 4);
            perror("Accept.");
            close(sock.sun_path._100_4_);
            iVar5 = unlink(pcVar10);
            if (iVar5 < 0) {
              perror("Unlink");
            }
            args_local._4_4_ = 0;
          }
          else {
            close(sock.sun_path._100_4_);
            unlink(pcVar10);
            args_local._4_4_ = 0;
          }
        }
      }
      break;
    case 1:
      if ((args[1] & 0xfff0000) == 0xe0000) {
        _buf = args[1] & 0xffff;
      }
      else if ((args[1] & 0xfff0000) == 0xf0000) {
        _buf = args[1] | 0xffff0000;
      }
      else {
        if ((*(ushort *)((ulong)(MDStypetbl + (args[1] >> 9)) ^ 2) & 0x7ff) != 2) goto LAB_00161ddd;
        pLVar7 = NativeAligned4FromLAddr(args[1]);
        _buf = *pLVar7;
      }
      if ((args[2] & 0xfff0000) == 0xe0000) {
        d[2] = (uchar)args[2];
      }
      else if ((args[2] & 0xfff0000) == 0xf0000) {
        d[2] = (uchar)args[2];
      }
      else {
        if ((*(ushort *)((ulong)(MDStypetbl + (args[2] >> 9)) ^ 2) & 0x7ff) != 2) goto LAB_00161ddd;
        pLVar7 = NativeAligned4FromLAddr(args[2]);
        d[2] = (uchar)*pLVar7;
      }
      PipeName._5_1_ = d[2];
      if ((((-1 < (int)_buf) && ((int)_buf < NPROCS)) && (UJ[(int)_buf].type != UJUNUSED)) &&
         (UJ[(int)_buf].status == -1)) {
        UVar1 = UJ[(int)_buf].type;
        if (UVar1 == UJSOSTREAM) {
LAB_00160527:
          sVar12 = write(_buf,(void *)((long)&PipeName + 5),1);
          if ((int)sVar12 != 0) {
            LVar6 = GetSmallp(1);
            return LVar6;
          }
          wait_for_comm_processes();
          return 0;
        }
        if (UVar1 == UJSOCKET) {
          return 0;
        }
        if ((uint)(UVar1 + ~UJSOCKET) < 2) goto LAB_00160527;
        if (UVar1 == UJUNUSED) {
          return 0;
        }
      }
      goto LAB_00161ddd;
    case 2:
      if ((args[1] & 0xfff0000) == 0xe0000) {
        _buf = args[1] & 0xffff;
      }
      else if ((args[1] & 0xfff0000) == 0xf0000) {
        _buf = args[1] | 0xffff0000;
      }
      else {
        if ((*(ushort *)((ulong)(MDStypetbl + (args[1] >> 9)) ^ 2) & 0x7ff) != 2) goto LAB_00161ddd;
        pLVar7 = NativeAligned4FromLAddr(args[1]);
        _buf = *pLVar7;
      }
      if ((((int)_buf < 0) || (NPROCS <= (int)_buf)) || (UJ[(int)_buf].type == UJUNUSED)) {
        return 0;
      }
      UVar1 = UJ[(int)_buf].type;
      if (UVar1 == UJSOSTREAM) {
LAB_00160695:
        alarm(TIMEOUT_TIME);
        do {
          piVar13 = __errno_location();
          *piVar13 = 0;
          sVar12 = read(_buf,(void *)((long)&PipeName + 4),1);
          iVar5 = (int)sVar12;
          bVar14 = false;
          if (iVar5 == -1) {
            piVar13 = __errno_location();
            bVar14 = *piVar13 == 4;
          }
        } while (bVar14);
        alarm(0);
        if (iVar5 < 1) {
          wait_for_comm_processes();
          if ((iVar5 == 0) && (UJ[(int)_buf].status == -1)) {
            args_local._4_4_ = 0x4c;
          }
          else if ((UJ[(int)_buf].status == -1) &&
                  ((piVar13 = __errno_location(), *piVar13 == 0xb ||
                   (piVar13 = __errno_location(), *piVar13 == 0xb)))) {
            args_local._4_4_ = 0x4c;
          }
          else {
            args_local._4_4_ = 0;
          }
        }
        else {
          args_local._4_4_ = GetSmallp((ulong)PipeName._4_1_);
        }
      }
      else {
        if (UVar1 != UJSOCKET) {
          if ((uint)(UVar1 + ~UJSOCKET) < 2) goto LAB_00160695;
          if (UVar1 != UJUNUSED) goto switchD_00160074_caseD_3;
        }
        args_local._4_4_ = 0;
      }
      break;
    case 3:
switchD_00160074_caseD_3:
      if ((args[1] & 0xfff0000) == 0xe0000) {
        _buf = args[1] & 0xffff;
      }
      else if ((args[1] & 0xfff0000) == 0xf0000) {
        _buf = args[1] | 0xffff0000;
      }
      else {
        if ((*(ushort *)((ulong)(MDStypetbl + (args[1] >> 9)) ^ 2) & 0x7ff) != 2) goto LAB_00161ddd;
        pLVar7 = NativeAligned4FromLAddr(args[1]);
        _buf = *pLVar7;
      }
      if ((((int)_buf < 0) || (NPROCS <= (int)_buf)) || (UJ[(int)_buf].type == UJUNUSED)) {
        args_local._4_4_ = 0x4c;
      }
      else {
        close(_buf);
        switch(UJ[(int)_buf].type) {
        case UJSOSTREAM:
        case UJUNUSED:
          break;
        case UJSOCKET:
          if (UJ[(int)_buf].pathname != (char *)0x0) {
            iVar5 = unlink(UJ[(int)_buf].pathname);
            if (iVar5 < 0) {
              perror("Kill 3 unlink");
            }
            free(UJ[(int)_buf].pathname);
            UJ[(int)_buf].pathname = (char *)0x0;
          }
          break;
        case UJPROCESS:
        case UJSHELL:
          SlavePTY[0x1c] = '\0';
          SlavePTY[0x1d] = '\0';
          SlavePTY[0x1e] = '\0';
          SlavePTY[0x1f] = '\0';
          while (((int)SlavePTY._28_4_ < 10 &&
                 (wait_for_comm_processes(), UJ[(int)_buf].status == -1))) {
            usleep(10000);
            SlavePTY._28_4_ = SlavePTY._28_4_ + 1;
          }
          if (UJ[(int)_buf].status == -1) {
            kill(UJ[(int)_buf].PID,9);
            SlavePTY[0x18] = '\0';
            SlavePTY[0x19] = '\0';
            SlavePTY[0x1a] = '\0';
            SlavePTY[0x1b] = '\0';
            for (; (int)SlavePTY._24_4_ < 10; SlavePTY._24_4_ = SlavePTY._24_4_ + 1) {
              wait_for_comm_processes();
              usleep(10000);
              if (UJ[(int)_buf].status != -1) break;
            }
          }
        }
        UJ[(int)_buf].type = UJUNUSED;
        UJ[(int)_buf].PID = 0;
        UJ[(int)_buf].pathname = (char *)0x0;
        args_local._4_4_ = GetSmallp((long)UJ[(int)_buf].status);
      }
      break;
    case 4:
    case 0xb:
      bufp._4_4_ = FindAvailablePty((char *)&local_e8);
      if ((int)bufp._4_4_ < 0) {
        printf("Open of lisp side of PTY failed.\n");
        fflush(_stdout);
        args_local._4_4_ = 0;
      }
      else {
        PipeName._6_1_ = 0x50;
        if (slot == 4) {
          PipeName._6_1_ = 0x53;
        }
        PipeName._7_1_ = local_e8;
        local_28 = local_e7;
        local_27 = (byte)bufp._4_4_;
        local_26 = 0;
        local_25 = 0;
        write(UnixPipeOut,(void *)((long)&PipeName + 6),6);
        sVar9 = strlen((char *)&local_e8);
        bufp._2_2_ = (short)sVar9 + 1;
        write(UnixPipeOut,(void *)((long)&bufp + 2),2);
        write(UnixPipeOut,&local_e8,(ulong)bufp._2_2_);
        if (slot != 4) {
          WriteLispStringToPipe(args[1]);
          WriteLispStringToPipe(args[2]);
        }
        SAFEREAD(UnixPipeIn,(uchar *)((long)&PipeName + 6),6);
        uVar4 = bufp._4_4_;
        if (local_27 == 1) {
          uVar3 = fcntl(bufp._4_4_,3,0);
          fcntl(uVar4,4,(ulong)(uVar3 | 0x800));
          UJ[(int)bufp._4_4_].type = UJSHELL;
          UJ[(int)bufp._4_4_].PID =
               CONCAT13(local_25,CONCAT12(local_26,CONCAT11(PipeName._7_1_,local_28)));
          printf("Shell job %d, PID = %d\n",(ulong)bufp._4_4_,(ulong)(uint)UJ[(int)bufp._4_4_].PID);
          UJ[(int)bufp._4_4_].status = -1;
          args_local._4_4_ = GetSmallp((long)(int)bufp._4_4_);
        }
        else {
          printf("Fork failed.\n");
          fflush(_stdout);
          printf("d = %d, %d, %d, %d, %d, %d\n",(ulong)PipeName._6_1_,(ulong)PipeName._7_1_,
                 (ulong)local_28,(ulong)local_27,(ulong)local_26,(uint)local_25);
          close(bufp._4_4_);
          args_local._4_4_ = 0;
        }
      }
      break;
    case 5:
      close_unix_descriptors();
      args_local._4_4_ = 0x4c;
      break;
    case 6:
      memset((void *)((long)&PipeName + 6),0,6);
      PipeName._6_1_ = 0x43;
      if ((args[1] & 0xfff0000) == 0xe0000) {
        d._2_4_ = args[1] & 0xffff;
      }
      else if ((args[1] & 0xfff0000) == 0xf0000) {
        d._2_4_ = args[1] | 0xffff0000;
      }
      else {
        if ((*(ushort *)((ulong)(MDStypetbl + (args[1] >> 9)) ^ 2) & 0x7ff) != 2) goto LAB_00161ddd;
        pLVar7 = NativeAligned4FromLAddr(args[1]);
        d._2_4_ = *pLVar7;
      }
      PipeName._7_1_ = d[2];
      local_27 = 1;
      write(UnixPipeOut,(uchar *)((long)&PipeName + 6),6);
      SAFEREAD(UnixPipeIn,(uchar *)((long)&PipeName + 6),6);
      switch(UJ[(int)d._2_4_].type) {
      case UJUNUSED:
        break;
      case UJSOSTREAM:
        close(d._2_4_);
        break;
      case UJSOCKET:
        close(d._2_4_);
        if (UJ[(int)d._2_4_].pathname != (char *)0x0) {
          unlink(UJ[(int)d._2_4_].pathname);
          free(UJ[(int)d._2_4_].pathname);
          UJ[(int)d._2_4_].pathname = (char *)0x0;
        }
        break;
      case UJPROCESS:
        close(d._2_4_);
        break;
      case UJSHELL:
        close(d._2_4_);
      }
      UJ[(int)d._2_4_].type = UJUNUSED;
      UJ[(int)d._2_4_].PID = 0;
      args_local._4_4_ = 0x4c;
      break;
    case 7:
      if ((args[1] & 0xfff0000) == 0xe0000) {
        _buf = args[1] & 0xffff;
      }
      else if ((args[1] & 0xfff0000) == 0xf0000) {
        _buf = args[1] | 0xffff0000;
      }
      else {
        if ((*(ushort *)((ulong)(MDStypetbl + (args[1] >> 9)) ^ 2) & 0x7ff) != 2) goto LAB_00161ddd;
        pLVar7 = NativeAligned4FromLAddr(args[1]);
        _buf = *pLVar7;
      }
      wait_for_comm_processes();
      if (UJ[(int)_buf].status == -1) {
        args_local._4_4_ = 0x4c;
      }
      else {
        args_local._4_4_ = GetSmallp((long)UJ[(int)_buf].status);
      }
      break;
    case 8:
      args_local._4_4_ = GetSmallp(0xf);
      break;
    case 9:
      if ((args[1] & 0xfff0000) == 0xe0000) {
        _buf = args[1] & 0xffff;
      }
      else if ((args[1] & 0xfff0000) == 0xf0000) {
        _buf = args[1] | 0xffff0000;
      }
      else {
        if ((*(ushort *)((ulong)(MDStypetbl + (args[1] >> 9)) ^ 2) & 0x7ff) != 2) goto LAB_00161ddd;
        pLVar7 = NativeAligned4FromLAddr(args[1]);
        _buf = *pLVar7;
      }
      if ((((int)_buf < 0) || (NPROCS <= (int)_buf)) || (UJ[(int)_buf].type == UJUNUSED)) {
        return 0;
      }
      pDVar11 = NativeAligned2FromLAddr(args[2]);
      UVar1 = UJ[(int)_buf].type;
      if (UVar1 == UJSOSTREAM) {
LAB_001610fb:
        sVar12 = read(_buf,pDVar11,0x200);
        iVar5 = (int)sVar12;
        word_swap_page(pDVar11,0x80);
        if (iVar5 < 1) {
          wait_for_comm_processes();
          if ((((iVar5 == 0) || (piVar13 = __errno_location(), *piVar13 == 4)) ||
              ((piVar13 = __errno_location(), *piVar13 == 0 ||
               ((piVar13 = __errno_location(), *piVar13 == 0xb ||
                (piVar13 = __errno_location(), *piVar13 == 0xb)))))) && (UJ[(int)_buf].status == -1)
             ) {
            args_local._4_4_ = 0x4c;
          }
          else {
            args_local._4_4_ = 0;
          }
        }
        else {
          args_local._4_4_ = GetSmallp((long)iVar5);
        }
      }
      else {
        if (UVar1 != UJSOCKET) {
          if ((uint)(UVar1 + ~UJSOCKET) < 2) goto LAB_001610fb;
          if (UVar1 != UJUNUSED) goto switchD_00160074_caseD_a;
        }
        args_local._4_4_ = 0;
      }
      break;
    case 10:
switchD_00160074_caseD_a:
      if ((args[1] & 0xfff0000) == 0xe0000) {
        _buf = args[1] & 0xffff;
      }
      else if ((args[1] & 0xfff0000) == 0xf0000) {
        _buf = args[1] | 0xffff0000;
      }
      else {
        if ((*(ushort *)((ulong)(MDStypetbl + (args[1] >> 9)) ^ 2) & 0x7ff) != 2) goto LAB_00161ddd;
        pLVar7 = NativeAligned4FromLAddr(args[1]);
        _buf = *pLVar7;
      }
      if ((args[2] & 0xfff0000) == 0xe0000) {
        pgrp._0_2_ = (undefined2)args[2];
      }
      else if ((args[2] & 0xfff0000) == 0xf0000) {
        pgrp._0_2_ = (undefined2)args[2];
      }
      else {
        if ((*(ushort *)((ulong)(MDStypetbl + (args[2] >> 9)) ^ 2) & 0x7ff) != 2) goto LAB_00161ddd;
        pLVar7 = NativeAligned4FromLAddr(args[2]);
        pgrp._0_2_ = (undefined2)*pLVar7;
      }
      if ((args[3] & 0xfff0000) == 0xe0000) {
        pty._0_2_ = (undefined2)args[3];
      }
      else if ((args[3] & 0xfff0000) == 0xf0000) {
        pty._0_2_ = (undefined2)args[3];
      }
      else {
        if ((*(ushort *)((ulong)(MDStypetbl + (args[3] >> 9)) ^ 2) & 0x7ff) != 2) goto LAB_00161ddd;
        pLVar7 = NativeAligned4FromLAddr(args[3]);
        pty._0_2_ = (undefined2)*pLVar7;
      }
      uVar4 = _buf;
      if ((((int)_buf < 0) || (NPROCS <= (int)_buf)) ||
         ((UJ[(int)_buf].type == UJUNUSED ||
          ((UJ[(int)_buf].type != UJSHELL || (UJ[(int)_buf].status != -1)))))) {
        args_local._4_4_ = 0;
      }
      else {
        sock_1.sun_path[0x68] = (char)pgrp;
        sock_1.sun_path[0x69] = pgrp._1_1_;
        sock_1.sun_path[0x6a] = (char)pty;
        sock_1.sun_path[0x6b] = pty._1_1_;
        iVar5 = ioctl(_buf,0x5414,sock_1.sun_path + 0x68);
        if (((iVar5 < 0) || (__pgrp = tcgetpgrp(uVar4), __pgrp < 0)) ||
           (iVar5 = killpg(__pgrp,0x1c), iVar5 < 0)) {
          piVar13 = __errno_location();
          args_local._4_4_ = GetSmallp((long)*piVar13);
        }
        else {
          args_local._4_4_ = 0x4c;
        }
      }
      break;
    case 0xc:
      sock_1.sun_path._100_4_ = socket(1,1,0);
      if ((int)sock_1.sun_path._100_4_ < 0) {
        perror("socket open");
        args_local._4_4_ = 0;
      }
      else {
        pLVar7 = NativeAligned4FromLAddr(args[1]);
        if ((int)pLVar7[2] < 0x800) {
          local_26c = pLVar7[2];
        }
        else {
          local_26c = 0x800;
        }
        uVar8 = (ulong)(int)local_26c;
        if (*(char *)((long)pLVar7 + 6) == 'C') {
          pDVar11 = NativeAligned2FromLAddr(*pLVar7 & 0xfffffff);
          lf_i = (size_t)shcom;
          lf_dptr = (char *)((long)pDVar11 + (long)(int)(uint)(ushort)pLVar7[1]);
          for (lf_ii = 0; lf_ii < uVar8; lf_ii = lf_ii + 1) {
            *(undefined1 *)lf_i = *(undefined1 *)((ulong)lf_dptr ^ 3);
            lf_i = lf_i + 1;
            lf_dptr = lf_dptr + 1;
          }
          shcom[uVar8] = '\0';
        }
        else if (*(char *)((long)pLVar7 + 6) == 'D') {
          pDVar11 = NativeAligned2FromLAddr(*pLVar7 & 0xfffffff);
          lf_length = (size_t)(pDVar11 + (int)(uint)(ushort)pLVar7[1]);
          lf_sbase = (short *)shcom;
          for (local_1d0 = 0; local_1d0 < uVar8; local_1d0 = local_1d0 + 1) {
            *(char *)lf_sbase = (char)*(undefined2 *)(lf_length ^ 2);
            lf_length = lf_length + 2;
            lf_sbase = (short *)((long)lf_sbase + 1);
          }
          *(undefined1 *)lf_sbase = 0;
        }
        else {
          error("LispStringToCString: Not a character array.\n");
        }
        sVar9 = strlen(shcom);
        pcVar10 = (char *)malloc(sVar9 + 1);
        UJ[(int)sock_1.sun_path._100_4_].pathname = pcVar10;
        strcpy(UJ[(int)sock_1.sun_path._100_4_].pathname,shcom);
        lf_arrayp._2_2_ = 1;
        strcpy((char *)((long)&lf_arrayp + 4),shcom);
        iVar5 = bind(sock_1.sun_path._100_4_,(sockaddr *)((long)&lf_arrayp + 2),0x6e);
        if (iVar5 < 0) {
          close(sock_1.sun_path._100_4_);
          free(UJ[(int)sock_1.sun_path._100_4_].pathname);
          UJ[(int)sock_1.sun_path._100_4_].type = UJUNUSED;
          perror("binding Lisp sockets");
          args_local._4_4_ = 0;
        }
        else {
          iVar5 = listen(sock_1.sun_path._100_4_,1);
          if (iVar5 < 0) {
            perror("Listen");
          }
          uVar2 = sock_1.sun_path._100_4_;
          uVar4 = fcntl(sock_1.sun_path._100_4_,3,0);
          fcntl(uVar2,4,(ulong)(uVar4 | 0x800));
          UJ[(int)sock_1.sun_path._100_4_].status = -1;
          UJ[(int)sock_1.sun_path._100_4_].PID = -1;
          UJ[(int)sock_1.sun_path._100_4_].type = UJSOCKET;
          args_local._4_4_ = GetSmallp((long)(int)sock_1.sun_path._100_4_);
        }
      }
      break;
    case 0xd:
      if ((args[1] & 0xfff0000) == 0xe0000) {
        local_1dc = args[1] & 0xffff;
      }
      else if ((args[1] & 0xfff0000) == 0xf0000) {
        local_1dc = args[1] | 0xffff0000;
      }
      else {
        if ((*(ushort *)((ulong)(MDStypetbl + (args[1] >> 9)) ^ 2) & 0x7ff) != 2) goto LAB_00161ddd;
        pLVar7 = NativeAligned4FromLAddr(args[1]);
        local_1dc = *pLVar7;
      }
      if ((UJ[(int)local_1dc].type == UJSOCKET) && (UJ[(int)local_1dc].pathname != (char *)0x0)) {
        do {
          alarm(TIMEOUT_TIME);
          do {
            piVar13 = __errno_location();
            *piVar13 = 0;
            iVar5 = accept(local_1dc,(sockaddr *)0x0,(socklen_t *)0x0);
            bVar14 = false;
            if (iVar5 == -1) {
              piVar13 = __errno_location();
              bVar14 = *piVar13 == 4;
            }
          } while (bVar14);
          alarm(0);
          if (-1 < iVar5) {
            UJ[iVar5].status = -1;
            UJ[iVar5].PID = -1;
            UJ[iVar5].type = UJSOSTREAM;
            LVar6 = GetSmallp((long)iVar5);
            return LVar6;
          }
          piVar13 = __errno_location();
        } while (*piVar13 == 4);
        piVar13 = __errno_location();
        if (*piVar13 == 0xb) {
          args_local._4_4_ = GetSmallp(-1);
        }
        else {
          perror("Lisp socket accept");
          args_local._4_4_ = 0;
        }
      }
      else {
        args_local._4_4_ = 0;
      }
      break;
    case 0xe:
      if ((args[1] & 0xfff0000) == 0xe0000) {
        bufp_1._4_4_ = args[1] & 0xffff;
      }
      else if ((args[1] & 0xfff0000) == 0xf0000) {
        bufp_1._4_4_ = args[1] | 0xffff0000;
      }
      else {
        if ((*(ushort *)((ulong)(MDStypetbl + (args[1] >> 9)) ^ 2) & 0x7ff) != 2) goto LAB_00161ddd;
        pLVar7 = NativeAligned4FromLAddr(args[1]);
        bufp_1._4_4_ = *pLVar7;
      }
      if ((((int)bufp_1._4_4_ < 0) || (NPROCS <= (int)bufp_1._4_4_)) ||
         (UJ[(int)bufp_1._4_4_].type == UJUNUSED)) {
        args_local._4_4_ = 0;
      }
      else {
        args_local._4_4_ = GetSmallp((long)UJ[(int)bufp_1._4_4_].type);
      }
      break;
    case 0xf:
      if ((args[1] & 0xfff0000) == 0xe0000) {
        _buf = args[1] & 0xffff;
      }
      else if ((args[1] & 0xfff0000) == 0xf0000) {
        _buf = args[1] | 0xffff0000;
      }
      else {
        if ((*(ushort *)((ulong)(MDStypetbl + (args[1] >> 9)) ^ 2) & 0x7ff) != 2) goto LAB_00161ddd;
        pLVar7 = NativeAligned4FromLAddr(args[1]);
        _buf = *pLVar7;
      }
      pDVar11 = NativeAligned2FromLAddr(args[2]);
      if ((args[3] & 0xfff0000) == 0xe0000) {
        local_1fc = args[3] & 0xffff;
      }
      else if ((args[3] & 0xfff0000) == 0xf0000) {
        local_1fc = args[3] | 0xffff0000;
      }
      else {
        if ((*(ushort *)((ulong)(MDStypetbl + (args[3] >> 9)) ^ 2) & 0x7ff) != 2) goto LAB_00161ddd;
        pLVar7 = NativeAligned4FromLAddr(args[3]);
        local_1fc = *pLVar7;
      }
      UVar1 = UJ[(int)_buf].type;
      if (UVar1 == UJSOSTREAM) {
LAB_00161d2b:
        word_swap_page(pDVar11,(int)(local_1fc + 3) >> 2);
        sVar12 = write(_buf,pDVar11,(long)(int)local_1fc);
        iVar5 = (int)sVar12;
        word_swap_page(pDVar11,(int)(local_1fc + 3) >> 2);
        if (iVar5 < 1) {
          wait_for_comm_processes();
          if (((iVar5 == 0) || (piVar13 = __errno_location(), *piVar13 == 0xb)) &&
             (UJ[(int)_buf].status == -1)) {
            args_local._4_4_ = 0x4c;
          }
          else {
            args_local._4_4_ = 0;
          }
        }
        else {
          args_local._4_4_ = GetSmallp((long)iVar5);
        }
      }
      else {
        if (UVar1 != UJSOCKET) {
          if ((uint)(UVar1 + ~UJSOCKET) < 2) goto LAB_00161d2b;
          if (UVar1 != UJUNUSED) goto switchD_00160074_default;
        }
        args_local._4_4_ = 0;
      }
      break;
    default:
switchD_00160074_default:
      args_local._4_4_ = 0;
    }
  }
  else {
    if ((*args & 0xfff0000) == 0xf0000) {
      slot = *args | 0xffff0000;
      goto LAB_00160049;
    }
    if ((*(ushort *)((ulong)(MDStypetbl + (*args >> 9)) ^ 2) & 0x7ff) == 2) {
      pLVar7 = NativeAligned4FromLAddr(*args);
      slot = *pLVar7;
      goto LAB_00160049;
    }
LAB_00161ddd:
    args_local._4_4_ = 0;
  }
  return args_local._4_4_;
}

Assistant:

LispPTR Unix_handlecomm(LispPTR *args) {
  int command, dest, slot;
  unsigned char d[6];
  unsigned char ch;
  unsigned char buf[1];

  /* Get command */
  N_GETNUMBER(args[0], command, bad);
  DBPRINT(("\nUnix_handlecomm: command %d\n", command));

  switch (command) {
    case 0: /* Fork pipe process */
    {
      char *PipeName;
      int PipeFD, sockFD;

      /* First create the socket */
      struct sockaddr_un sock;
      sockFD = socket(AF_UNIX, SOCK_STREAM, 0);
      if (sockFD < 0) {
        perror("socket open");
        return (NIL);
      }

      /* then bind it to a canonical pathname */
      PipeName = build_socket_pathname(sockFD);
      memset(&sock, 0, sizeof(sock));
      sock.sun_family = AF_UNIX;
      strcpy(sock.sun_path, PipeName);
      if (bind(sockFD, (struct sockaddr *)&sock, sizeof(struct sockaddr_un)) < 0) {
        close(sockFD);
        perror("binding sockets");
        unlink(PipeName);
        return (NIL);
      }

      DBPRINT(("Socket %d bound to name %s.\n", sockFD, PipeName));

      if (listen(sockFD, 1) < 0) perror("Listen");

      memset(d, 0, sizeof(d));
      d[0] = 'F';
      d[3] = sockFD;
      write(UnixPipeOut, d, 6);
      WriteLispStringToPipe(args[1]);

      DBPRINT(("Sending cmd string: %s\n", shcom));

      /* Get status */
      SAFEREAD(UnixPipeIn, d, 6);

      /* If it worked, return job # */
      if (d[3] == 1) {
      case0_lp:
        TIMEOUT(PipeFD = accept(sockFD, NULL, NULL));
        if (PipeFD < 0) {
          if (errno == EINTR) goto case0_lp;
          perror("Accept.");
          close(sockFD);
          if (unlink(PipeName) < 0) perror("Unlink");
          return (NIL);
        }
        if (fcntl(PipeFD, F_SETFL, fcntl(PipeFD, F_GETFL, 0) | O_NONBLOCK) == -1) {
          perror("setting up fifo to nodelay");
          return (NIL);
        }
        UJ[PipeFD].type = UJPROCESS;
        UJ[PipeFD].status = -1;
        UJ[PipeFD].PID = (d[1] << 8) | d[2] | (d[4] << 16) | (d[5] << 24);
        close(sockFD);
        unlink(PipeName);
        DBPRINT(("New process: slot/PipeFD %d PID %d\n", PipeFD, UJ[PipeFD].PID));
        return (GetSmallp(PipeFD));
      } else {
        DBPRINT(("Fork request failed."));
        close(sockFD);
        unlink(PipeName);
        return (NIL);
      }
    }

    case 1: /* Write byte */
      /* Get job #, Byte */
      N_GETNUMBER(args[1], slot, bad);
      N_GETNUMBER(args[2], dest, bad);
      ch = dest; /* ch is a char */

      if (valid_slot(slot) && (UJ[slot].status == -1)) switch (UJ[slot].type) {
          case UJPROCESS:
          case UJSHELL:
          case UJSOSTREAM:
            dest = write(slot, &ch, 1);
            if (dest == 0) {
              wait_for_comm_processes();
              return (NIL);
            } else
              return (GetSmallp(1));

	  case UJSOCKET:
	  case UJUNUSED:
	    return (NIL);
        }
      break;

    case 2: /* Read byte */
      /**********************************************************/
      /* 							    */
      /* NB that it is possible for the other end of the stream */
      /* to have terminated, and hence status != -1.	    */
      /* EVEN IF THERE ARE STILL CHARACTERS TO READ.	    */
      /* 							    */
      /**********************************************************/

      N_GETNUMBER(args[1], slot, bad); /* Get job # */

      if (!valid_slot(slot)) return (NIL); /* No fd open; punt the read */
      switch (UJ[slot].type) {
        case UJPROCESS:
        case UJSHELL:
        case UJSOSTREAM:
          TIMEOUT(dest = read(slot, buf, 1));
          if (dest > 0) return (GetSmallp(buf[0]));
          /* Something's amiss; check our process status */
          wait_for_comm_processes();
          if ((dest == 0) &&
              (UJ[slot].status == -1)) { /* No available chars, but other guy still running */
            DBPRINT(("dest = 0, status still -1\n"));
            return (ATOM_T);
          }
          if ((UJ[slot].status == -1) &&
              ((errno == EWOULDBLOCK) ||
               (errno == EAGAIN))) { /* No available chars, but other guy still running */
            DBPRINT((" dest<0, EWOULDBLOCK\n"));
            return (ATOM_T);
          }
          /* At this point, we either got an I/O error, or there */
          /* were no chars available and the other end has terminated. */
          /* Either way, signal EOF. */
          DBPRINT(("Indicating EOF from PTY desc %d.\n", slot));
          return (NIL);

	case UJSOCKET:
	case UJUNUSED:
	    return (NIL);
      }

    case 3: /* Kill process */
            /* Maiko uses this as CLOSEF, so "process" is a misnomer */

      N_GETNUMBER(args[1], slot, bad);

      DBPRINT(("Terminating process in slot %d.\n", slot));
      if (!valid_slot(slot)) return (ATOM_T);
      /* in all cases we need to close() the file descriptor */
      if (slot == 0) DBPRINT(("ZERO SLOT\n"));
      close(slot);
      switch (UJ[slot].type) {
      case UJSHELL:
      case UJPROCESS:
        /* wait for up to 0.1s for it to exit on its own after the close() */
        for (int i = 0; i < 10; i++) {
          wait_for_comm_processes();
          if (UJ[slot].status != -1) break;
          usleep(10000);
        }
        /* check again before we terminate it */
        if (UJ[slot].status != -1) break;
        kill(UJ[slot].PID, SIGKILL);
        for (int i = 0; i < 10; i++) {
          /* Waiting for the process to exit is possibly risky.
             Sending SIGKILL is always supposed to kill
             a process, but on very rare occurrences this doesn't
             happen because of a Unix kernel bug, usually a user-
             written device driver which hasn't been fully
             debugged.  So we time it out just be safe. */
          wait_for_comm_processes();
          usleep(10000);
          if (UJ[slot].status != -1) break;
        }
        break;
      case UJSOCKET:
        if (UJ[slot].pathname) {
          DBPRINT(("Unlinking %s\n", UJ[slot].pathname));
          if (unlink(UJ[slot].pathname) < 0) perror("Kill 3 unlink");
          free(UJ[slot].pathname);
          UJ[slot].pathname = NULL;
        }
        break;
      case UJSOSTREAM:
      case UJUNUSED:
	break;
      }
      UJ[slot].type = UJUNUSED;
      UJ[slot].PID = 0;
      UJ[slot].pathname = NULL;

      /* If status available, return it, otherwise T */
      return (GetSmallp(UJ[slot].status));

    case 4:
    case 11: /* Fork PTY process */
    {
      char SlavePTY[32];
      int Master;
      unsigned short len;

      Master = FindAvailablePty(SlavePTY);
      DBPRINT(("Fork Shell; Master PTY = %d. Slave=%c%c.\n", Master, SlavePTY[0], SlavePTY[1]));
      if (Master < 0) {
        printf("Open of lisp side of PTY failed.\n");
        fflush(stdout);
        return (NIL);
      }

      d[0] = (command == 4) ? 'S' : 'P';
      d[1] = SlavePTY[0];
      d[2] = SlavePTY[1];
      d[3] = Master;
      d[4] = '\0';
      d[5] = '\0';
      write(UnixPipeOut, d, 6);

      len = strlen(SlavePTY) + 1;
      write(UnixPipeOut, &len, 2);
      write(UnixPipeOut, SlavePTY, len);

      if (command != 4) { /* New style has arg1 = termtype, arg2 = command */
        WriteLispStringToPipe(args[1]);
        WriteLispStringToPipe(args[2]);
      }

      /* Get status */
      SAFEREAD(UnixPipeIn, d, 6);

      /* If successful, return job # */
      DBPRINT(("Pipe/fork result = %d.\n", d[3]));
      if (d[3] == 1) {
        /* Set up the IO not to block */
        fcntl(Master, F_SETFL, fcntl(Master, F_GETFL, 0) | O_NONBLOCK);

        UJ[Master].type = UJSHELL; /* so we can find them */
        UJ[Master].PID = (d[1] << 8) | d[2] | (d[4] << 16) | (d[5] << 24);
        printf("Shell job %d, PID = %d\n", Master, UJ[Master].PID);
        UJ[Master].status = -1;
        DBPRINT(("Forked pty in slot %d.\n", Master));
        return (GetSmallp(Master));
      } else {
        printf("Fork failed.\n");
        fflush(stdout);
        printf("d = %d, %d, %d, %d, %d, %d\n", d[0], d[1], d[2], d[3], d[4], d[5]);
        close(Master);
        return (NIL);
      }
    }

    case 5: /* Kill all the subprocesses */ close_unix_descriptors(); return (ATOM_T);

    case 6: /* Kill this subprocess */
      memset(d, 0, sizeof(d));
      d[0] = 'C';

      /* Get job # */
      N_GETNUMBER(args[1], dest, bad);
      d[1] = dest;

      d[3] = 1;
      write(UnixPipeOut, d, 6);

      /* Get status */
      SAFEREAD(UnixPipeIn, d, 6);

      switch (UJ[dest].type) {
        case UJUNUSED:
          break;

        case UJSHELL:
          DBPRINT(("Kill 5 closing shell desc %d.\n", dest));
          close(dest);
          break;

        case UJPROCESS:
          DBPRINT(("Kill 5 closing process desc %d.\n", dest));
          close(dest);
          break;

        case UJSOCKET:
          /* close a socket; be sure and unlink the file handle */
          DBPRINT(("Kill 5 closing raw socket desc %d.\n", dest));
          close(dest);
          if (UJ[dest].pathname != NULL) {
            unlink(UJ[dest].pathname);
            free(UJ[dest].pathname);
            UJ[dest].pathname = NULL;
          } /* else return an error somehow... */
          break;

        case UJSOSTREAM:
          DBPRINT(("Kill 5 closing socket stream %d.\n", dest));
          close(dest);
          break;
      }

      UJ[dest].type = UJUNUSED;
      UJ[dest].PID = 0;
      return (ATOM_T);
    /* break; */

    case 7: /* Current job status */

      N_GETNUMBER(args[1], slot, bad); /* Get job # */
      wait_for_comm_processes();       /* Make sure we're up to date */

      if (UJ[slot].status == -1)
        return (ATOM_T);
      else
        return (GetSmallp(UJ[slot].status));

    case 8: /* Return largest supported command */ return (GetSmallp(15));

    case 9: /* Read buffer */
      /**********************************************************/
      /* 							    */
      /* NB that it is possible for the other end of the stream */
      /* to have terminated, and hence ForkedStatus != -1.	    */
      /* EVEN IF THERE ARE STILL CHARACTERS TO READ.	    */
      /* 							    */
      /**********************************************************/

      {
        DLword *bufp;
        int terno; /* holds errno thru sys calls after I/O fails */

        N_GETNUMBER(args[1], slot, bad);     /* Get job # */
        if (!valid_slot(slot)) return (NIL); /* No fd open; punt the read */

        bufp = (NativeAligned2FromLAddr(args[2])); /* User buffer */
        DBPRINT(("Read buffer slot %d, type is %d buffer LAddr 0x%x (native %p)\n", slot, UJ[slot].type, args[2], bufp));

        switch (UJ[slot].type) {
          case UJSHELL:
          case UJPROCESS:
          case UJSOSTREAM: dest = read(slot, bufp, 512);
#ifdef BYTESWAP
            word_swap_page(bufp, 128);
#endif /* BYTESWAP */

            if (dest > 0) { /* Got characters.  If debugging, print len &c */
              /* printf("got %d chars\n", dest); */
              return (GetSmallp(dest));
            }

            /* Something's amiss; update process status */
            DBPRINT(("Problem: Got status %d from read, errno %d.\n", dest, errno));
            wait_for_comm_processes(); /* make sure we're up to date */
            if (((dest == 0) || (errno == EINTR) || (errno == 0) || (errno == EAGAIN) ||
                 (errno == EWOULDBLOCK)) &&
                (UJ[slot].status == -1))
              /* No available chars, but other guy still running */
              return (ATOM_T);

            /* At this point, we either got an I/O error, or there */
            /* were no chars available and the other end has terminated. */
            /* Either way, signal EOF. */
            DBPRINT(("read failed; dest = %d, errno = %d, status = %d\n", dest, terno,
                     UJ[slot].status));
            DBPRINT(("Indicating EOF from PTY desc %d.\n", slot));
            return (NIL);

          case UJSOCKET:
          case UJUNUSED:
            return (NIL);
        }
      }

    case 10: /* Change window */
    {
      int rows, cols, pgrp, pty;
      struct winsize w;

      /* Get job #, rows, columns */
      N_GETNUMBER(args[1], slot, bad);
      N_GETNUMBER(args[2], rows, bad);
      N_GETNUMBER(args[3], cols, bad);

      if (valid_slot(slot) && (UJ[slot].type == UJSHELL) && (UJ[slot].status == -1)) {
        w.ws_row = rows;
        w.ws_col = cols;
        w.ws_xpixel = 0; /* not used */
        w.ws_ypixel = 0;
        pty = slot;
        /* Change window size, then
           notify process group of the change */
        if ((ioctl(pty, TIOCSWINSZ, &w) >= 0) &&
            ((pgrp = tcgetpgrp(pty)) >= 0) &&
            (killpg(pgrp, SIGWINCH) >= 0))
          return (ATOM_T);
        return (GetSmallp(errno));
      }

      return (NIL);
    }

    case 12: /* create Unix socket */

    {
      int sockFD;
      struct sockaddr_un sock;

      /* First open the socket */
      sockFD = socket(AF_UNIX, SOCK_STREAM, 0);
      if (sockFD < 0) {
        perror("socket open");
        return (NIL);
      }
      /* Then get a process slot and blit the pathname of the
         socket into it */
      /* need to type-check the string here */
      LispStringToCString(args[1], shcom, 2048);
      UJ[sockFD].pathname = malloc(strlen(shcom) + 1);
      strcpy(UJ[sockFD].pathname, shcom);
      /* Then bind it to the pathname, and get it	listening properly */

      sock.sun_family = AF_UNIX;
      strcpy(sock.sun_path, shcom);
      if (bind(sockFD, (struct sockaddr *)&sock, sizeof(struct sockaddr_un)) < 0) {
        close(sockFD);
        free(UJ[sockFD].pathname);
        UJ[sockFD].type = UJUNUSED;
        perror("binding Lisp sockets");
        return (NIL);
      }
      DBPRINT(("Socket %d bound to name %s.\n", sockFD, shcom));
      if (listen(sockFD, 1) < 0) perror("Listen");
      /* Set up the IO not to block */
      fcntl(sockFD, F_SETFL, fcntl(sockFD, F_GETFL, 0) | O_NONBLOCK);

      /* things seem sane, fill out the rest of the UJ slot and return */
      UJ[sockFD].status = -1;
      UJ[sockFD].PID = -1;
      UJ[sockFD].type = UJSOCKET;

      return (GetSmallp(sockFD));
    }

    case 13: /* try to accept */
    {
      /* returns file descriptor if successful,
         -1 if no connection available,
         NIL if failure */
      int sockFD, newFD;

      N_GETNUMBER(args[1], sockFD, bad);
      if (UJ[sockFD].type == UJSOCKET && UJ[sockFD].pathname != NULL) {
      /* sockFD SHOULD be non-blocking;
         but I'll time this out just in case */
      case13_lp:
        TIMEOUT(newFD = accept(sockFD, NULL, NULL));
        if (newFD < 0)
          if (errno == EINTR)
            goto case13_lp;
          else if (errno == EWOULDBLOCK)
            return (GetSmallp(-1));
          else {
            perror("Lisp socket accept");
            return (NIL);
          }
        else {
          UJ[newFD].status = -1;
          UJ[newFD].PID = -1;
          UJ[newFD].type = UJSOSTREAM;
          return (GetSmallp(newFD));
        }
      } else
        return (NIL);
    }

    case 14: /* return type of socket */
    {
      int streamFD;

      N_GETNUMBER(args[1], streamFD, bad);
      if (valid_slot(streamFD))
        return GetSmallp(UJ[streamFD].type);
      else
        return NIL;
    }

    case 15: /* Write buffer */
    {
      DLword *bufp;
      int i;
      N_GETNUMBER(args[1], slot, bad);              /* Get job # */
      bufp = (NativeAligned2FromLAddr(args[2])); /* User buffer */
      N_GETNUMBER(args[3], i, bad);                 /* # to write */
      DBPRINT(("Write buffer, type is %d\n", UJ[slot].type));

      switch (UJ[slot].type) {
        case UJSHELL:
        case UJPROCESS:
        case UJSOSTREAM:
#ifdef BYTESWAP
          word_swap_page(bufp, (i + 3) >> 2);
#endif /* BYTESWAP */

          dest = write(slot, bufp, i);
#ifdef BYTESWAP
          word_swap_page(bufp, (i + 3) >> 2);
#endif /* BYTESWAP */

          if (dest > 0) return (GetSmallp(dest));
          /* Something's amiss; update process status */
          wait_for_comm_processes(); /* make sure we're up to date */
          if (((dest == 0) || (errno == EWOULDBLOCK)) && (UJ[slot].status == -1))
            /* No room to write, but other guy still running */
            return (ATOM_T);
          /* At this point, we either got an I/O error, or there */
          /* were no chars available and the other end has terminated. */
          /* Either way, signal EOF. */
          DBPRINT(("Indicating write failure from PTY desc %d.\n", slot));
          return (NIL);

        case UJUNUSED:
        case UJSOCKET:
          return (NIL);
      }
    }

    default: return (NIL);
  }

bad:
  DBPRINT(("Bad input value."));
  return (NIL);
}